

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gherkin_line.c
# Opt level: O2

Items * GherkinLine_table_cells(GherkinLine *line)

{
  _Bool _Var1;
  wchar_t wVar2;
  Span *pSVar3;
  size_t sVar4;
  Items *pIVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  size_t sVar8;
  wchar_t *pwVar9;
  wchar_t *pwVar10;
  wchar_t *pwVar11;
  wchar_t wVar12;
  size_t __size;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  
  wVar2 = calculate_item_count(line->trimmed_line,find_cell_delimiter);
  if (wVar2 < L'\x02') {
    pIVar5 = (Items *)0x0;
  }
  else {
    wVar2 = wVar2 + L'\xffffffff';
    __size = (ulong)(uint)wVar2 << 4;
    pSVar3 = (Span *)malloc(__size);
    for (sVar4 = 0; __size != sVar4; sVar4 = sVar4 + 0x10) {
      *(undefined4 *)((long)&pSVar3->column + sVar4) = 0;
      *(undefined8 *)((long)&pSVar3->text + sVar4) = 0;
    }
    pIVar5 = (Items *)malloc(0x10);
    pIVar5->count = wVar2;
    pIVar5->items = pSVar3;
    pwVar9 = line->trimmed_line;
    for (uVar15 = 0; uVar15 != (uint)wVar2; uVar15 = uVar15 + 1) {
      pwVar10 = line->line_text;
      pwVar6 = find_cell_delimiter(pwVar9);
      if (pwVar6 == (wchar_t *)0x0) {
        return pIVar5;
      }
      if (*pwVar6 == L'\0') {
        return pIVar5;
      }
      pwVar11 = pwVar6 + 1;
      pwVar7 = find_cell_delimiter(pwVar11);
      if (pwVar7 == (wchar_t *)0x0) {
        return pIVar5;
      }
      if (*pwVar7 == L'\0') {
        return pIVar5;
      }
      uVar13 = (long)pwVar7 - (long)pwVar6;
      while ((uVar13 = uVar13 - 4, pwVar6 = pwVar7, pwVar11 < pwVar7 &&
             (_Var1 = StringUtilities_is_whitespace(*pwVar11), _Var1))) {
        pwVar11 = pwVar11 + 1;
      }
      do {
        uVar14 = uVar13;
        if (pwVar6 <= pwVar11) break;
        _Var1 = StringUtilities_is_whitespace(pwVar6[-1]);
        pwVar6 = pwVar6 + -1;
        uVar13 = uVar14 - 4;
      } while (_Var1);
      sVar8 = StringUtilities_code_point_length_for_part
                        (pwVar9,(wchar_t)((ulong)((long)pwVar11 - (long)pwVar9) >> 2));
      pSVar3[uVar15].column =
           (int)sVar8 + (int)((ulong)((long)pwVar9 - (long)pwVar10) >> 2) + L'\x01';
      pwVar6 = StringUtilities_copy_string_part(pwVar11,(wchar_t)(uVar14 >> 2));
      pwVar9 = pwVar6;
      pwVar10 = pwVar6;
LAB_0011ccfa:
      while (pwVar11 = pwVar10, wVar12 = *pwVar11, wVar12 == L'\\') {
        wVar12 = pwVar11[1];
        if ((wVar12 == L'\\') || (wVar12 == L'|')) goto LAB_0011cd47;
        if (wVar12 != L'n') goto LAB_0011cd33;
        *pwVar9 = L'\n';
        pwVar9 = pwVar9 + 1;
        pwVar10 = pwVar11 + 2;
      }
      if (wVar12 != L'\0') {
        pwVar10 = pwVar11 + 1;
        goto LAB_0011cd4b;
      }
      *pwVar9 = L'\0';
      pSVar3[uVar15].text = pwVar6;
      pwVar9 = pwVar7;
    }
  }
  return pIVar5;
LAB_0011cd33:
  *pwVar9 = L'\\';
  pwVar9 = pwVar9 + 1;
  wVar12 = pwVar11[1];
  pwVar10 = pwVar11 + 1;
  if (wVar12 != L'\0') {
LAB_0011cd47:
    pwVar10 = pwVar11 + 2;
LAB_0011cd4b:
    *pwVar9 = wVar12;
    pwVar9 = pwVar9 + 1;
  }
  goto LAB_0011ccfa;
}

Assistant:

const Items* GherkinLine_table_cells(const GherkinLine* line) {
    int item_count = calculate_cell_count(line->trimmed_line);
    if (item_count == 0)
        return (Items*)0;
    Span* items = (Span*)malloc(item_count * sizeof(Span));
    int i;
    for (i = 0; i < item_count; ++i) {
        items[i].column = 0;
        items[i].text = 0;
    }
    Items* item_array = (Items*)malloc(sizeof(Items));
    item_array->count = item_count;
    item_array->items = items;
    const wchar_t* current_pos = line->trimmed_line;
    for (i = 0; i < item_count; ++i) {
        current_pos = populate_cell_data(&items[i], current_pos, current_pos - line->line_text);
        if (!current_pos)
            break;
    }
    return item_array;
}